

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

double __thiscall
TwoStageDynamicBayesianNetwork::GetYProbability
          (TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *X,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *A,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Y)

{
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface *pMVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pSVar4;
  CPDDiscreteInterface *pCVar5;
  Index IVar6;
  long lVar7;
  E *this_00;
  uint y;
  ulong uVar8;
  double dVar9;
  allocator_type local_99;
  double local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_restr;
  
  local_90 = A;
  lVar7 = (**(code **)((long)*this->_m_madp + 400))();
  if (((long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2 == lVar7) &&
     ((long)(X->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(X->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 == lVar7)) {
    pMVar1 = this->_m_madp;
    puVar2 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_80 = X;
    lVar7 = (**(code **)(*(long *)((long)&pMVar1->field_0x0 + *(long *)((long)*pMVar1 + -0x40)) +
                        0x10))((long)&pMVar1->field_0x0 + *(long *)((long)*pMVar1 + -0x40));
    if ((long)puVar2 - (long)puVar3 >> 2 == lVar7) {
      dVar9 = 1.0;
      y = 0;
      local_98 = 1.0;
      local_88 = Y;
      while( true ) {
        uVar8 = (ulong)y;
        if ((ulong)((long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar8) break;
        pSVar4 = (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&X_restr,(long)pSVar4[uVar8].super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&pSVar4[uVar8].super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl >> 2,(allocator_type *)&A_restr);
        IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                  (local_80,(this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar8,&X_restr);
        pSVar4 = (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&A_restr,(long)pSVar4[uVar8].super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&pSVar4[uVar8].super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl >> 2,(allocator_type *)&Y_restr);
        IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                  (local_90,(this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar8,&A_restr);
        pSVar4 = (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&Y_restr,(long)pSVar4[uVar8].super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&pSVar4[uVar8].super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl >> 2,&local_99);
        Y = local_88;
        IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                  (local_88,(this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar8,&Y_restr);
        IVar6 = IndividualToJointYiiIndices
                          (this,y,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  &X_restr.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                           &A_restr,&Y_restr);
        pCVar5 = (this->_m_Y_CPDs).
                 super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8];
        (*pCVar5->_vptr_CPDDiscreteInterface[2])
                  (pCVar5,(ulong)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar8],(ulong)IVar6);
        local_98 = local_98 * dVar9;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&Y_restr);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&A_restr);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&X_restr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        y = y + 1;
      }
      return local_98;
    }
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full joint actions");
  }
  else {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full state vectors");
  }
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

double TwoStageDynamicBayesianNetwork::
GetYProbability( const vector<Index>& X,
                    const vector<Index>& A,
                    const vector<Index>& Y) const
{
    size_t nrSF = _m_madp->GetNrStateFactors();
    if(Y.size() != nrSF || X.size() != nrSF)
        throw E("TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full state vectors");
    if(A.size() != _m_madp->GetNrAgents())
        throw E("TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full joint actions");
    
    double p = 1.0;
    for(Index y=0; y < Y.size(); y++)
    {
        vector<Index> X_restr(GetXSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(X, GetXSoI_Y(y), X_restr );
        vector<Index> A_restr(GetASoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(A, GetASoI_Y(y), A_restr );
        vector<Index> Y_restr(GetYSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(Y, GetYSoI_Y(y), Y_restr );
        Index iiI = IndividualToJointYiiIndices(y, X_restr, A_restr, Y_restr);
        Index yVal = Y[y];
        double p_y = _m_Y_CPDs[y]->Get(yVal, iiI);  
        p *= p_y;
    }
    return(p);
}